

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall r_comp::Compiler::read_sys_object(Compiler *this,Ptr *node,Ptr *view)

{
  Class *this_00;
  element_type *peVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  ImageObject *pIVar4;
  Metadata *pMVar5;
  Image *this_01;
  bool bVar6;
  bool bVar7;
  char cVar8;
  byte bVar9;
  size_type sVar10;
  iterator iVar11;
  SysObject *this_02;
  mapped_type *this_03;
  Atom *this_04;
  SysView *this_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_06;
  string *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  allocator local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  ImageObject *local_1f8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *local_1f0;
  string label;
  Ptr argNode;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_c0;
  string label_1;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  if (((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type ==
      Structure) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(this->local_references)._M_h);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->hlp_references);
    bVar6 = std::operator!=(&((node->
                              super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->label,"");
    this->in_hlp = false;
    peVar1 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar1->args).
        super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (peVar1->args).
        super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (bVar6) {
        std::__cxx11::string::string
                  ((string *)&label,"error: label not followed by expression",(allocator *)&argNode)
        ;
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_70,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        set_error(this,&label,(Ptr *)&local_70);
        this_06 = &local_70._M_refcount;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&label,"error: missing expression opening",(allocator *)&argNode);
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_80,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        set_error(this,&label,(Ptr *)&local_80);
        this_06 = &local_80._M_refcount;
      }
    }
    else {
      sVar10 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)this->_metadata,&peVar1->cmd);
      if (sVar10 == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&argNode
                       ,"error: unknown class \'",
                       &((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
                        ._M_ptr)->cmd);
        std::operator+(&label,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &argNode,"\'");
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_90,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        set_error(this,&label,(Ptr *)&local_90);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
        std::__cxx11::string::~string((string *)&label);
        psVar12 = (string *)&argNode;
        goto LAB_00131aa9;
      }
      iVar11 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)this->_metadata,
                      &((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->cmd);
      this_00 = &this->current_class;
      Class::operator=(this_00,(Class *)((long)iVar11.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                               ._M_cur + 0x28));
      psVar12 = &(this->current_class).str_opcode;
      bVar7 = std::operator==(psVar12,"mdl");
      if ((bVar7) || (bVar7 = std::operator==(psVar12,"cst"), bVar7)) {
        this->in_hlp = true;
      }
      local_200 = psVar12;
      this_02 = (SysObject *)operator_new(0x70);
      r_code::SysObject::SysObject(this_02);
      this->current_object = (ImageObject *)this_02;
      if (bVar6) {
        std::__cxx11::string::substr
                  ((ulong)&label_1,
                   (ulong)&((node->
                            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->label);
        ppSVar2 = (this->_image->code_segment).objects.m_vector.
                  super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppSVar3 = (this->_image->code_segment).objects.m_vector.
                  super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        Class::Class((Class *)&argNode,ANY);
        Reference::Reference
                  ((Reference *)&label,(long)ppSVar3 - (long)ppSVar2 >> 3,this_00,(Class *)&argNode)
        ;
        this_03 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->_metadata->global_references,&label_1);
        Reference::operator=(this_03,(Reference *)&label);
        Reference::~Reference((Reference *)&label);
        Class::~Class((Class *)&argNode);
        std::__cxx11::string::~string((string *)&label_1);
        this_02 = (SysObject *)this->current_object;
      }
      local_1f0 = &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
      this_04 = r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(this_02 + 8),0);
      r_code::Atom::operator=(this_04,&this_00->atom);
      cVar8 = r_code::Atom::getAtomCount();
      if (cVar8 != '\0') {
        bVar9 = r_code::Atom::getAtomCount();
        label._M_dataplus._M_p._0_2_ = bVar9 + 1;
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_c0,local_1f0);
        bVar6 = expression_tail(this,(Ptr *)&local_c0,this_00,1,(uint16_t *)&label,true);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
        if (!bVar6) {
          return false;
        }
      }
      pbVar13 = local_200;
      pIVar4 = this->current_object;
      peVar1 = (view->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar1->args).
          super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (peVar1->args).
          super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_1f8 = pIVar4;
        if ((peVar1->type == Atom) || (bVar6 = std::operator!=(&peVar1->cmd,"|[]"), !bVar6))
        goto LAB_00131e82;
        std::__cxx11::string::string((string *)&label,"expected a view set",(allocator *)&argNode);
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_100,
                   &view->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        set_error(this,&label,(Ptr *)&local_100);
        this_06 = &local_100._M_refcount;
      }
      else {
        if (peVar1->type == Set) {
          bVar6 = std::operator==(local_200,"grp");
          if (bVar6) {
            pMVar5 = this->_metadata;
            std::__cxx11::string::string((string *)&label,"grp_view",(allocator *)&argNode);
            iVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)pMVar5,&label);
            Class::operator=(this_00,(Class *)((long)iVar11.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                                  ._M_cur + 0x28));
          }
          else {
            bVar6 = std::operator==(pbVar13,"ipgm");
            if ((((bVar6) || (bVar6 = std::operator==(pbVar13,"icpp_pgm"), bVar6)) ||
                (bVar6 = std::operator==(pbVar13,"mdl"), bVar6)) ||
               (bVar6 = std::operator==(pbVar13,"cst"), bVar6)) {
              pMVar5 = this->_metadata;
              std::__cxx11::string::string((string *)&label,"pgm_view",(allocator *)&argNode);
              iVar11 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)pMVar5,&label);
              Class::operator=(this_00,(Class *)((long)iVar11.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                                  ._M_cur + 0x28));
            }
            else {
              pMVar5 = this->_metadata;
              std::__cxx11::string::string((string *)&label,"view",(allocator *)&argNode);
              iVar11 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)pMVar5,&label);
              Class::operator=(this_00,(Class *)((long)iVar11.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                                                  ._M_cur + 0x28));
            }
          }
          std::__cxx11::string::~string((string *)&label);
          (this->current_class).use_as = I_CLASS;
          peVar1 = (view->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (peVar1->args).
                    super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (peVar1->args).
                      super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          local_1f8 = pIVar4;
          while (pbVar13 != local_200) {
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&argNode.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)pbVar13);
            this_05 = (SysView *)operator_new(0x38);
            r_code::SysView::SysView(this_05);
            this->current_object = (ImageObject *)this_05;
            label_1._M_dataplus._M_p._0_2_ = 0;
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_e0,
                       &argNode.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
            ;
            bVar6 = read_set(this,(Ptr *)&local_e0,true,this_00,0,(uint16_t *)&label_1,true);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
            if (bVar6) {
              r_code::vector<r_code::SysView_*>::push_back
                        ((vector<r_code::SysView_*> *)(pIVar4 + 0x50),
                         (SysView *)this->current_object);
            }
            else {
              std::__cxx11::string::string
                        ((string *)&label," error: illegal element in set",&local_201);
              std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_f0,
                         &argNode.
                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
              set_error(this,&label,(Ptr *)&local_f0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_f0._M_refcount);
              std::__cxx11::string::~string((string *)&label);
              if (this->current_object != (ImageObject *)0x0) {
                (**(code **)(*(long *)this->current_object + 8))();
              }
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&argNode.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &pbVar13->field_2;
            if (!bVar6) {
              return false;
            }
          }
LAB_00131e82:
          pIVar4 = local_1f8;
          if (this->trace == true) {
            (**(code **)(*(long *)local_1f8 + 0x20))(local_1f8);
          }
          std::__cxx11::string::substr
                    ((ulong)&label,
                     (ulong)&((__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)
                             &local_1f0->_M_ptr)->_M_ptr->label);
          this_01 = this->_image;
          std::__cxx11::string::string((string *)&local_50,(string *)&label);
          Image::add_sys_object(this_01,(SysObject *)pIVar4,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&label);
          return true;
        }
        std::operator+(&label,"expected a view set, got ",&peVar1->cmd);
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_d0,
                   &view->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        set_error(this,&label,(Ptr *)&local_d0);
        this_06 = &local_d0._M_refcount;
      }
    }
  }
  else {
    std::__cxx11::string::string((string *)&label,"expected expression",(allocator *)&argNode);
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
    ;
    set_error(this,&label,(Ptr *)&local_60);
    this_06 = &local_60._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_06);
  psVar12 = &label;
LAB_00131aa9:
  std::__cxx11::string::~string((string *)psVar12);
  return false;
}

Assistant:

bool Compiler::read_sys_object(RepliStruct::Ptr node, RepliStruct::Ptr view)
{
    if (node->type != RepliStruct::Structure) {
        set_error("expected expression", node);
        return false;
    }

    local_references.clear();
    hlp_references.clear();
    bool hasLabel = node->label != "";
    in_hlp = false;

    if (node->args.size() == 0) {
        if (hasLabel) {
            set_error("error: label not followed by expression", node);
        } else {
            set_error("error: missing expression opening", node);
        }

        return false;
    }

    if (_metadata->classes.count(node->cmd) == 0) {
        set_error("error: unknown class '" + node->cmd + "'", node);
        return false;
    }

    current_class = _metadata->classes.find(node->cmd)->second;

    if (current_class.str_opcode == "mdl" || current_class.str_opcode == "cst") {
        in_hlp = true;
    }

    current_object = new SysObject();

    if (hasLabel) {
        std::string label = node->label.substr(0, node->label.size() - 1);
        _metadata->global_references[label] = Reference(_image->code_segment.objects.size(), current_class, Class());
    }

    current_object->code[0] = current_class.atom;

    if (current_class.atom.getAtomCount()) {
        uint16_t extent_index = current_class.atom.getAtomCount() + 1;

        if (!expression_tail(node, current_class, 1, extent_index, true)) {
            return false;
        }
    }

    SysObject *sys_object = (SysObject *)current_object; // current_object will point to views, if any.

    // compile view set
    // input format:
    // []
    // [view-data]
    // ...
    // [view-data]
    // or:
    // |[]

    if (view->args.size() > 0) {
        if (view->type != RepliStruct::Set) {
            set_error("expected a view set, got " + view->cmd, view);
            return false;
        }

        if (current_class.str_opcode == "grp") {
            current_class = _metadata->classes.find("grp_view")->second;
        } else if (current_class.str_opcode == "ipgm" ||
                   current_class.str_opcode == "icpp_pgm" ||
                   current_class.str_opcode == "mdl" ||
                   current_class.str_opcode == "cst") {
            current_class = _metadata->classes.find("pgm_view")->second;
        } else {
            current_class = _metadata->classes.find("view")->second;
        }

        current_class.use_as = StructureMember::I_CLASS;
        uint16_t count = 0;

        for (RepliStruct::Ptr argNode : view->args) {
            current_object = new SysView();
            uint16_t extent_index = 0;

            if (!read_set(argNode, true, &current_class, 0, extent_index, true)) {
                set_error(" error: illegal element in set", argNode);
                delete current_object;
                return false;
            }

            count++;
            sys_object->views.push_back((SysView *)current_object);
        }
    } else if (view->type != RepliStruct::Atom && view->cmd != "|[]") {
        set_error("expected a view set", view);
        return false;
    }

    if (trace) {
        sys_object->trace();
    }

    // TODO: what happens if hasLabel == false
    std::string label = node->label.substr(0, node->label.size() - 1);
    _image->add_sys_object(sys_object, label);
    return true;
}